

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

int __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  cmCPackLog *pcVar1;
  Compress c;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  unsigned_long uVar7;
  ulong skip;
  void *pvVar8;
  reference pbVar9;
  pointer pbVar10;
  reference pbVar11;
  size_t sVar12;
  reference pbVar13;
  size_type sVar14;
  mode_t permissions_;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  byte local_2e8a;
  undefined1 local_29f8 [8];
  cmGeneratedFileStream ofs;
  string local_27a8;
  string local_2788 [8];
  string tmpFile;
  int res;
  allocator local_273a;
  allocator local_2739;
  string local_2738;
  string local_2718 [8];
  string outputFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2698;
  undefined1 local_2678 [8];
  string topLevelString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2620;
  undefined1 local_2600 [8];
  string localcopy;
  string filenamename;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_25b8;
  iterator i;
  string local_25a8;
  undefined1 local_2588 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  controlExtraList;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  setStrictFiles;
  string local_2538;
  byte local_2512;
  allocator local_2511;
  undefined1 local_2510 [6];
  bool permissionStrictPolicy;
  char *local_24f0;
  char *controlExtra;
  string local_24c8;
  undefined1 local_24a8 [8];
  ostringstream cmCPackLog_msg_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2328;
  string local_2308;
  undefined4 local_22e8;
  undefined4 local_22e4;
  mode_t permission755;
  mode_t permissionExecute;
  mode_t permission644;
  allocator local_22b1;
  string local_22b0;
  allocator local_2289;
  string local_2288;
  undefined1 local_2268 [8];
  cmArchiveWrite control_tar;
  undefined1 local_2168 [8];
  ostringstream cmCPackLog_msg_7;
  undefined1 local_1ff0 [8];
  cmGeneratedFileStream fileStream_control_tar;
  string filename_control_tar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d68;
  allocator local_1d41;
  undefined1 local_1d40 [8];
  string output;
  undefined1 local_1d00 [8];
  ostringstream cmCPackLog_msg_6;
  char local_1b88 [8];
  char md5sum [33];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b50;
  const_iterator fileIt_3;
  string local_1b40;
  string local_1b20 [8];
  string topLevelWithTrailingSlash;
  cmGeneratedFileStream out_2;
  string md5filename;
  string local_1878;
  undefined1 local_1858 [8];
  ostringstream cmCPackLog_msg_5;
  string local_16e0;
  string local_16c0 [32];
  undefined1 local_16a0 [8];
  ostringstream cmCPackLog_msg_4;
  string local_1528 [8];
  string relativeDir;
  size_type slashPos;
  undefined1 local_14e0 [8];
  ostringstream cmCPackLog_msg_3;
  _Self local_1368;
  _Self local_1360;
  const_iterator fileIt_2;
  string local_1350;
  string local_1330;
  _Base_ptr local_1310;
  undefined1 local_1308;
  undefined1 local_1300 [8];
  string currentPath;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_12d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_12d0;
  const_iterator fileIt_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  orderedFiles;
  undefined1 local_1278 [8];
  ostringstream cmCPackLog_msg_2;
  size_t topLevelLength;
  string local_10f0;
  allocator local_10c9;
  string local_10c8;
  allocator local_10a1;
  string local_10a0;
  undefined1 local_1080 [8];
  cmArchiveWrite data_tar;
  string local_f98 [32];
  undefined1 local_f78 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_e00 [8];
  cmGeneratedFileStream fileStream_data_tar;
  undefined1 local_b98 [8];
  string filename_data_tar;
  undefined1 local_b58 [8];
  ostringstream cmCPackLog_msg;
  undefined1 local_9e0 [8];
  string compression_suffix;
  string local_9b8;
  char *local_998;
  char *debian_compression_type;
  Compress tar_compression_type;
  undefined1 local_968 [8];
  string strGenWDIR;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_940;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_938;
  const_iterator fileIt;
  string local_928;
  string local_908 [8];
  string dirName;
  unsigned_long totalSize;
  cmGeneratedFileStream out_1;
  string local_690;
  char *local_670;
  char *debian_pkg_source;
  string local_660;
  char *local_640;
  char *debian_pkg_replaces;
  string local_630;
  char *local_610;
  char *debian_pkg_provides;
  string local_600;
  char *local_5e0;
  char *debian_pkg_conflicts;
  string local_5d0;
  char *local_5b0;
  char *debian_pkg_breaks;
  string local_5a0;
  char *local_580;
  char *debian_pkg_enhances;
  string local_570;
  char *local_550;
  char *debian_pkg_predep;
  string local_540;
  char *local_520;
  char *debian_pkg_url;
  string local_510;
  char *local_4f0;
  char *debian_pkg_sug;
  string local_4e0;
  char *local_4c0;
  char *debian_pkg_rec;
  string local_4b0;
  char *local_490;
  char *debian_pkg_dep;
  string local_480;
  char *local_460;
  char *desc;
  string local_450;
  char *local_430;
  char *maintainer;
  string local_420;
  char *local_400;
  char *debian_pkg_arch;
  string local_3f0;
  char *local_3d0;
  char *debian_pkg_priority;
  string local_3c0;
  char *local_3a0;
  char *debian_pkg_section;
  string local_390;
  char *local_370;
  char *debian_pkg_version;
  string local_360;
  string local_340;
  undefined1 local_320 [8];
  string debian_pkg_name;
  string local_2f8;
  string local_2d8 [8];
  string ctlfilename;
  cmGeneratedFileStream out;
  allocator local_59;
  string local_58;
  string local_38 [8];
  string dbfilename;
  cmCPackDebGenerator *this_local;
  
  dbfilename.field_2._8_8_ = this;
  std::__cxx11::string::string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"GEN_WDIR",&local_59);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_58);
  std::__cxx11::string::operator+=(local_38,pcVar5);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::operator+=(local_38,"/debian-binary");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&ctlfilename.field_2 + 8),pcVar5,false);
  std::operator<<((ostream *)((long)&ctlfilename.field_2 + 8),"2.0");
  std::ostream::operator<<
            ((void *)((long)&ctlfilename.field_2 + 8),std::endl<char,std::char_traits<char>>);
  cmGeneratedFileStream::~cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&ctlfilename.field_2 + 8));
  std::__cxx11::string::string(local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2f8,"GEN_WDIR",
             (allocator *)(debian_pkg_name.field_2._M_local_buf + 0xf));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2f8);
  std::__cxx11::string::operator=(local_2d8,pcVar5);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)(debian_pkg_name.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=(local_2d8,"/control");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_360,"GEN_CPACK_DEBIAN_PACKAGE_NAME",
             (allocator *)((long)&debian_pkg_version + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_340,pcVar5,(allocator *)((long)&debian_pkg_version + 6));
  cmsys::SystemTools::LowerCase((string *)local_320,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_version + 6));
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_version + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_390,"GEN_CPACK_DEBIAN_PACKAGE_VERSION",
             (allocator *)((long)&debian_pkg_section + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_section + 7));
  local_370 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3c0,"GEN_CPACK_DEBIAN_PACKAGE_SECTION",
             (allocator *)((long)&debian_pkg_priority + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_priority + 7));
  local_3a0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3f0,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY",
             (allocator *)((long)&debian_pkg_arch + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_arch + 7));
  local_3d0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_420,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE",
             (allocator *)((long)&maintainer + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator((allocator<char> *)((long)&maintainer + 7));
  local_400 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_450,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER",
             (allocator *)((long)&desc + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)((long)&desc + 7));
  local_430 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_480,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION",
             (allocator *)((long)&debian_pkg_dep + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_dep + 7));
  local_460 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4b0,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS",
             (allocator *)((long)&debian_pkg_rec + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_rec + 7));
  local_490 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4e0,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS",
             (allocator *)((long)&debian_pkg_sug + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_sug + 7));
  local_4c0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_510,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS",
             (allocator *)((long)&debian_pkg_url + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_url + 7));
  local_4f0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_540,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE",
             (allocator *)((long)&debian_pkg_predep + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_540);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_predep + 7));
  local_520 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_570,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS",
             (allocator *)((long)&debian_pkg_enhances + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_enhances + 7));
  local_550 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a0,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES",
             (allocator *)((long)&debian_pkg_breaks + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_5a0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_breaks + 7));
  local_580 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS",
             (allocator *)((long)&debian_pkg_conflicts + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_conflicts + 7));
  local_5b0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_600,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS",
             (allocator *)((long)&debian_pkg_provides + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_provides + 7));
  local_5e0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_630,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES",
             (allocator *)((long)&debian_pkg_replaces + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_630);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_replaces + 7));
  local_610 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_660,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES",
             (allocator *)((long)&debian_pkg_source + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_source + 7));
  local_640 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_690,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE",(allocator *)&out_1.field_0x247)
  ;
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)&out_1.field_0x247);
  local_670 = pcVar5;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&totalSize,pcVar5,false);
  poVar6 = std::operator<<((ostream *)&totalSize,"Package: ");
  poVar6 = std::operator<<(poVar6,(string *)local_320);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Version: ");
  poVar6 = std::operator<<(poVar6,local_370);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Section: ");
  poVar6 = std::operator<<(poVar6,local_3a0);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Priority: ");
  poVar6 = std::operator<<(poVar6,local_3d0);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Architecture: ");
  poVar6 = std::operator<<(poVar6,local_400);
  std::operator<<(poVar6,"\n");
  if ((local_670 != (char *)0x0) && (*local_670 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Source: ");
    poVar6 = std::operator<<(poVar6,local_670);
    std::operator<<(poVar6,"\n");
  }
  if ((local_490 != (char *)0x0) && (*local_490 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Depends: ");
    poVar6 = std::operator<<(poVar6,local_490);
    std::operator<<(poVar6,"\n");
  }
  if ((local_4c0 != (char *)0x0) && (*local_4c0 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Recommends: ");
    poVar6 = std::operator<<(poVar6,local_4c0);
    std::operator<<(poVar6,"\n");
  }
  if ((local_4f0 != (char *)0x0) && (*local_4f0 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Suggests: ");
    poVar6 = std::operator<<(poVar6,local_4f0);
    std::operator<<(poVar6,"\n");
  }
  if ((local_520 != (char *)0x0) && (*local_520 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Homepage: ");
    poVar6 = std::operator<<(poVar6,local_520);
    std::operator<<(poVar6,"\n");
  }
  if ((local_550 != (char *)0x0) && (*local_550 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Pre-Depends: ");
    poVar6 = std::operator<<(poVar6,local_550);
    std::operator<<(poVar6,"\n");
  }
  if ((local_580 != (char *)0x0) && (*local_580 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Enhances: ");
    poVar6 = std::operator<<(poVar6,local_580);
    std::operator<<(poVar6,"\n");
  }
  if ((local_5b0 != (char *)0x0) && (*local_5b0 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Breaks: ");
    poVar6 = std::operator<<(poVar6,local_5b0);
    std::operator<<(poVar6,"\n");
  }
  if ((local_5e0 != (char *)0x0) && (*local_5e0 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Conflicts: ");
    poVar6 = std::operator<<(poVar6,local_5e0);
    std::operator<<(poVar6,"\n");
  }
  if ((local_610 != (char *)0x0) && (*local_610 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Provides: ");
    poVar6 = std::operator<<(poVar6,local_610);
    std::operator<<(poVar6,"\n");
  }
  if ((local_640 != (char *)0x0) && (*local_640 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Replaces: ");
    poVar6 = std::operator<<(poVar6,local_640);
    std::operator<<(poVar6,"\n");
  }
  dirName.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_928,"CPACK_TEMPORARY_DIRECTORY",
             (allocator *)((long)&fileIt._M_current + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_928);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_908,pcVar5,(allocator *)((long)&fileIt._M_current + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&fileIt._M_current + 6));
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fileIt._M_current + 7));
  std::__cxx11::string::operator+=(local_908,'/');
  local_940._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->packageFiles);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_938,&local_940);
  while( true ) {
    strGenWDIR.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->packageFiles);
    bVar2 = __gnu_cxx::operator!=
                      (&local_938,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&strGenWDIR.field_2 + 8));
    if (!bVar2) break;
    pbVar11 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_938);
    uVar7 = cmsys::SystemTools::FileLength(pbVar11);
    dirName.field_2._8_8_ = uVar7 + dirName.field_2._8_8_;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_938);
  }
  std::__cxx11::string::~string(local_908);
  poVar6 = std::operator<<((ostream *)&totalSize,"Installed-Size: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,dirName.field_2._8_8_ + 0x3ff >> 10);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Maintainer: ");
  poVar6 = std::operator<<(poVar6,local_430);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Description: ");
  poVar6 = std::operator<<(poVar6,local_460);
  std::operator<<(poVar6,"\n");
  std::ostream::operator<<(&totalSize,std::endl<char,std::char_traits<char>>);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&totalSize);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&tar_compression_type,"GEN_WDIR",
             (allocator *)((long)&debian_compression_type + 7));
  pcVar5 = cmCPackGenerator::GetOption
                     (&this->super_cmCPackGenerator,(string *)&tar_compression_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_968,pcVar5,(allocator *)((long)&debian_compression_type + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_compression_type + 6));
  std::__cxx11::string::~string((string *)&tar_compression_type);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_compression_type + 7));
  debian_compression_type._0_4_ = CompressGZip;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9b8,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE",
             (allocator *)(compression_suffix.field_2._M_local_buf + 0xf));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_9b8);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(compression_suffix.field_2._M_local_buf + 0xf));
  local_998 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    local_998 = "gzip";
  }
  std::__cxx11::string::string((string *)local_9e0);
  iVar4 = strcmp(local_998,"lzma");
  if (iVar4 == 0) {
    std::__cxx11::string::operator=((string *)local_9e0,".lzma");
    debian_compression_type._0_4_ = CompressLZMA;
  }
  else {
    iVar4 = strcmp(local_998,"xz");
    if (iVar4 == 0) {
      std::__cxx11::string::operator=((string *)local_9e0,".xz");
      debian_compression_type._0_4_ = CompressXZ;
    }
    else {
      iVar4 = strcmp(local_998,"bzip2");
      if (iVar4 == 0) {
        std::__cxx11::string::operator=((string *)local_9e0,".bz2");
        debian_compression_type._0_4_ = CompressBZip2;
      }
      else {
        iVar4 = strcmp(local_998,"gzip");
        if (iVar4 == 0) {
          std::__cxx11::string::operator=((string *)local_9e0,".gz");
          debian_compression_type._0_4_ = CompressGZip;
        }
        else {
          iVar4 = strcmp(local_998,"none");
          if (iVar4 == 0) {
            std::__cxx11::string::operator=((string *)local_9e0,"");
            debian_compression_type._0_4_ = CompressNone;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b58);
            poVar6 = std::operator<<((ostream *)local_b58,"Error unrecognized compression type: ");
            poVar6 = std::operator<<(poVar6,local_998);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                            ,0x1bb,pcVar5);
            std::__cxx11::string::~string((string *)(filename_data_tar.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b58);
          }
        }
      }
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fileStream_data_tar.field_0x240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_968,
                 "/data.tar");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fileStream_data_tar.field_0x240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9e0);
  std::__cxx11::string::~string((string *)&fileStream_data_tar.field_0x240);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_e00);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_e00,pcVar5,false,true);
  bVar3 = std::ios::operator!((ios *)(local_e00 + (long)*(_func_int **)((long)local_e00 + -0x18)));
  c = (Compress)debian_compression_type;
  if ((bVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_10a0,"paxr",&local_10a1);
    cmArchiveWrite::cmArchiveWrite((cmArchiveWrite *)local_1080,(ostream *)local_e00,c,&local_10a0);
    std::__cxx11::string::~string((string *)&local_10a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
    cmArchiveWrite::SetUIDAndGID((cmArchiveWrite *)local_1080,0,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_10c8,"root",&local_10c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_10f0,"root",(allocator *)((long)&topLevelLength + 7));
    cmArchiveWrite::SetUNAMEAndGNAME((cmArchiveWrite *)local_1080,&local_10c8,&local_10f0);
    std::__cxx11::string::~string((string *)&local_10f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&topLevelLength + 7));
    std::__cxx11::string::~string((string *)&local_10c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
    skip = std::__cxx11::string::length();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1278);
    poVar6 = std::operator<<((ostream *)local_1278,"WDIR: \"");
    poVar6 = std::operator<<(poVar6,(string *)local_968);
    poVar6 = std::operator<<(poVar6,"\", length = ");
    pvVar8 = (void *)std::ostream::operator<<(poVar6,skip);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1dc,pcVar5);
    std::__cxx11::string::~string
              ((string *)&orderedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1278);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&fileIt_1);
    local_12d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->packageFiles);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_12d0,&local_12d8);
    while( true ) {
      currentPath.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->packageFiles);
      bVar2 = __gnu_cxx::operator!=
                        (&local_12d0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&currentPath.field_2 + 8));
      if (!bVar2) break;
      pbVar11 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_12d0);
      std::__cxx11::string::string((string *)local_1300,(string *)pbVar11);
      while (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1300,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_968), bVar2) {
        pVar15 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&fileIt_1,(value_type *)local_1300);
        local_1310 = (_Base_ptr)pVar15.first._M_node;
        local_1308 = pVar15.second;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1350,"..",(allocator *)((long)&fileIt_2._M_node + 7));
        cmSystemTools::CollapseCombinedPath(&local_1330,(string *)local_1300,&local_1350);
        std::__cxx11::string::operator=((string *)local_1300,(string *)&local_1330);
        std::__cxx11::string::~string((string *)&local_1330);
        std::__cxx11::string::~string((string *)&local_1350);
        std::allocator<char>::~allocator((allocator<char> *)((long)&fileIt_2._M_node + 7));
      }
      std::__cxx11::string::~string((string *)local_1300);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_12d0);
    }
    local_1360._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fileIt_1);
    while( true ) {
      local_1368._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fileIt_1);
      bVar2 = std::operator!=(&local_1360,&local_1368);
      if (!bVar2) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_14e0);
      poVar6 = std::operator<<((ostream *)local_14e0,"FILEIT: \"");
      pbVar9 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_1360);
      poVar6 = std::operator<<(poVar6,(string *)pbVar9);
      poVar6 = std::operator<<(poVar6,"\"");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x1f6,pcVar5);
      std::__cxx11::string::~string((string *)&slashPos);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_14e0);
      pbVar10 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator->(&local_1360);
      relativeDir.field_2._8_8_ = std::__cxx11::string::find((char)pbVar10,0x2f);
      pbVar10 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator->(&local_1360);
      std::__cxx11::string::substr((ulong)local_1528,(ulong)pbVar10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_16a0);
      poVar6 = std::operator<<((ostream *)local_16a0,"RELATIVEDIR: \"");
      poVar6 = std::operator<<(poVar6,local_1528);
      poVar6 = std::operator<<(poVar6,"\"");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x1fb,pcVar5);
      std::__cxx11::string::~string(local_16c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_16a0);
      pbVar9 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_1360);
      std::__cxx11::string::string((string *)&local_16e0,(string *)pbVar9);
      bVar2 = cmArchiveWrite::Add((cmArchiveWrite *)local_1080,&local_16e0,skip,".",false);
      std::__cxx11::string::~string((string *)&local_16e0);
      bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1858);
        poVar6 = std::operator<<((ostream *)local_1858,"Problem adding file to tar:");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"#top level directory: ");
        poVar6 = std::operator<<(poVar6,(string *)local_968);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"#file: ");
        pbVar9 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1360);
        poVar6 = std::operator<<(poVar6,(string *)pbVar9);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"#error:");
        cmArchiveWrite::GetError_abi_cxx11_(&local_1878,(cmArchiveWrite *)local_1080);
        poVar6 = std::operator<<(poVar6,(string *)&local_1878);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_1878);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                        ,0x205,pcVar5);
        std::__cxx11::string::~string((string *)(md5filename.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1858);
        this_local._4_4_ = 0;
      }
      data_tar.PermissionsMask._5_3_ = 0;
      data_tar.PermissionsMask.IsValueSet = bVar2;
      std::__cxx11::string::~string(local_1528);
      if (data_tar.PermissionsMask._4_4_ != 0) goto LAB_004b2743;
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_1360);
    }
    data_tar.PermissionsMask.IsValueSet = false;
    data_tar.PermissionsMask._5_3_ = 0;
LAB_004b2743:
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&fileIt_1);
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_1080);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f78);
    poVar6 = std::operator<<((ostream *)local_f78,"Error opening the file \"");
    poVar6 = std::operator<<(poVar6,(string *)local_b98);
    poVar6 = std::operator<<(poVar6,"\" for writing");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1ca,pcVar5);
    std::__cxx11::string::~string(local_f98);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f78);
    this_local._4_4_ = 0;
    data_tar.PermissionsMask.IsValueSet = true;
    data_tar.PermissionsMask._5_3_ = 0;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_e00);
  if (data_tar.PermissionsMask._4_4_ == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &out_2.field_0x240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_968,
                   "/md5sums");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)((long)&topLevelWithTrailingSlash.field_2 + 8),pcVar5,false)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1b40,"CPACK_TEMPORARY_DIRECTORY",
               (allocator *)((long)&fileIt_3._M_current + 7));
    pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1b40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b20,pcVar5,(allocator *)((long)&fileIt_3._M_current + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&fileIt_3._M_current + 6));
    std::__cxx11::string::~string((string *)&local_1b40);
    std::allocator<char>::~allocator((allocator<char> *)((long)&fileIt_3._M_current + 7));
    std::__cxx11::string::operator+=(local_1b20,'/');
    local_1b58._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->packageFiles);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1b50,&local_1b58);
    while( true ) {
      register0x00000000 =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->packageFiles);
      bVar2 = __gnu_cxx::operator!=
                        (&local_1b50,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(md5sum + 0x20));
      if (!bVar2) break;
      pbVar11 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_1b50);
      bVar2 = cmsys::SystemTools::FileIsDirectory(pbVar11);
      if (!bVar2) {
        pbVar11 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1b50);
        bVar2 = cmsys::SystemTools::FileIsSymlink(pbVar11);
        if (!bVar2) {
          pbVar11 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_1b50);
          bVar2 = cmSystemTools::ComputeFileMD5(pbVar11,local_1b88);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d00);
            poVar6 = std::operator<<((ostream *)local_1d00,"Problem computing the md5 of ");
            pbVar11 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_1b50);
            poVar6 = std::operator<<(poVar6,(string *)pbVar11);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                            ,0x223,pcVar5);
            std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d00);
          }
          md5sum[0x18] = '\0';
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_1d40,local_1b88,&local_1d41);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d41);
          pbVar11 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_1b50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&filename_control_tar.field_2 + 8),"  ",pbVar11);
          std::operator+(&local_1d68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&filename_control_tar.field_2 + 8),"\n");
          std::__cxx11::string::operator+=((string *)local_1d40,(string *)&local_1d68);
          std::__cxx11::string::~string((string *)&local_1d68);
          std::__cxx11::string::~string((string *)(filename_control_tar.field_2._M_local_buf + 8));
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmsys::SystemTools::ReplaceString((string *)local_1d40,pcVar5,"");
          std::operator<<((ostream *)((long)&topLevelWithTrailingSlash.field_2 + 8),
                          (string *)local_1d40);
          std::__cxx11::string::~string((string *)local_1d40);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1b50);
    }
    std::__cxx11::string::~string(local_1b20);
    cmGeneratedFileStream::~cmGeneratedFileStream
              ((cmGeneratedFileStream *)((long)&topLevelWithTrailingSlash.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fileStream_control_tar.field_0x240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_968,
                   "/control.tar.gz");
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_1ff0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_1ff0,pcVar5,false,true);
    bVar3 = std::ios::operator!((ios *)(local_1ff0 + (long)*(_func_int **)((long)local_1ff0 + -0x18)
                                       ));
    if ((bVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2288,"paxr",&local_2289);
      cmArchiveWrite::cmArchiveWrite
                ((cmArchiveWrite *)local_2268,(ostream *)local_1ff0,CompressGZip,&local_2288);
      std::__cxx11::string::~string((string *)&local_2288);
      std::allocator<char>::~allocator((allocator<char> *)&local_2289);
      cmArchiveWrite::SetUIDAndGID((cmArchiveWrite *)local_2268,0,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_22b0,"root",&local_22b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&permission644,"root",(allocator *)((long)&permissionExecute + 3));
      cmArchiveWrite::SetUNAMEAndGNAME
                ((cmArchiveWrite *)local_2268,&local_22b0,(string *)&permission644);
      std::__cxx11::string::~string((string *)&permission644);
      std::allocator<char>::~allocator((allocator<char> *)((long)&permissionExecute + 3));
      std::__cxx11::string::~string((string *)&local_22b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_22b1);
      permission755 = 0x1a4;
      local_22e4 = 0x49;
      local_22e8 = 0x1ed;
      cmArchiveWrite::SetPermissions((cmArchiveWrite *)local_2268,0x1a4);
      std::__cxx11::string::string((string *)&local_2308,(string *)&out_2.field_0x240);
      sVar12 = std::__cxx11::string::length();
      bVar2 = cmArchiveWrite::Add((cmArchiveWrite *)local_2268,&local_2308,sVar12,".",true);
      local_2e8a = 1;
      if (bVar2) {
        std::operator+(&local_2328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_968,"/control");
        sVar12 = std::__cxx11::string::length();
        bVar2 = cmArchiveWrite::Add((cmArchiveWrite *)local_2268,&local_2328,sVar12,".",true);
        local_2e8a = bVar2 ^ 0xff;
        std::__cxx11::string::~string((string *)&local_2328);
      }
      std::__cxx11::string::~string((string *)&local_2308);
      if ((local_2e8a & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_2510,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA",&local_2511);
        pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_2510);
        std::__cxx11::string::~string((string *)local_2510);
        std::allocator<char>::~allocator((allocator<char> *)&local_2511);
        local_24f0 = pcVar5;
        if (pcVar5 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_2538,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION",
                     (allocator *)
                     ((long)&setStrictFiles._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
          bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_2538);
          std::__cxx11::string::~string((string *)&local_2538);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&setStrictFiles._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
          local_2512 = bVar2;
          std::
          set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::set<char_const**>((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&controlExtraList.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              createDeb::strictFiles,(char **)&copy_ar::pad);
          cmArchiveWrite::ClearPermissions((cmArchiveWrite *)local_2268);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2588);
          pcVar5 = local_24f0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_25a8,pcVar5,(allocator *)((long)&i._M_current + 7));
          cmSystemTools::ExpandListArgument
                    (&local_25a8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2588,false);
          std::__cxx11::string::~string((string *)&local_25a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
          local_25b8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2588);
          while( true ) {
            filenamename.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2588);
            bVar2 = __gnu_cxx::operator!=
                              (&local_25b8,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filenamename.field_2 + 8));
            if (!bVar2) break;
            pbVar13 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_25b8);
            cmsys::SystemTools::GetFilenameName((string *)((long)&localcopy.field_2 + 8),pbVar13);
            std::operator+(&local_2620,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_968,"/");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2600,&local_2620,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&localcopy.field_2 + 8));
            std::__cxx11::string::~string((string *)&local_2620);
            if ((local_2512 & 1) != 0) {
              sVar14 = std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&controlExtraList.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (key_type *)((long)&localcopy.field_2 + 8));
              permissions_ = 0x1a4;
              if (sVar14 != 0) {
                permissions_ = 0x1ed;
              }
              cmArchiveWrite::SetPermissions((cmArchiveWrite *)local_2268,permissions_);
            }
            pbVar13 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_25b8);
            bVar2 = cmsys::SystemTools::CopyFileIfDifferent(pbVar13,(string *)local_2600);
            if (bVar2) {
              std::__cxx11::string::string
                        ((string *)
                         &arFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_2600);
              sVar12 = std::__cxx11::string::length();
              cmArchiveWrite::Add((cmArchiveWrite *)local_2268,
                                  (string *)
                                  &arFiles.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar12,".",
                                  true);
              std::__cxx11::string::~string
                        ((string *)
                         &arFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            std::__cxx11::string::~string((string *)local_2600);
            std::__cxx11::string::~string((string *)(localcopy.field_2._M_local_buf + 8));
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_25b8);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2588);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&controlExtraList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        data_tar.PermissionsMask.IsValueSet = false;
        data_tar.PermissionsMask._5_3_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_24a8);
        poVar6 = std::operator<<((ostream *)local_24a8,"Error adding file to tar:");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"#top level directory: ");
        poVar6 = std::operator<<(poVar6,(string *)local_968);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"#file: \"control\" or \"md5sums\"");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"#error:");
        cmArchiveWrite::GetError_abi_cxx11_(&local_24c8,(cmArchiveWrite *)local_2268);
        poVar6 = std::operator<<(poVar6,(string *)&local_24c8);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_24c8);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                        ,0x262,pcVar5);
        std::__cxx11::string::~string((string *)&controlExtra);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_24a8);
        this_local._4_4_ = 0;
        data_tar.PermissionsMask.IsValueSet = true;
        data_tar.PermissionsMask._5_3_ = 0;
      }
      cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_2268);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2168);
      poVar6 = std::operator<<((ostream *)local_2168,"Error opening the file \"");
      poVar6 = std::operator<<(poVar6,(string *)&fileStream_control_tar.field_0x240);
      poVar6 = std::operator<<(poVar6,"\" for writing");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x240,pcVar5);
      std::__cxx11::string::~string((string *)&control_tar.PermissionsMask);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2168);
      this_local._4_4_ = 0;
      data_tar.PermissionsMask.IsValueSet = true;
      data_tar.PermissionsMask._5_3_ = 0;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1ff0);
    if (data_tar.PermissionsMask._4_4_ == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&topLevelString.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2678
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_968
                     ,"/");
      std::operator+(&local_2698,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2678
                     ,"debian-binary");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&topLevelString.field_2 + 8),&local_2698);
      std::__cxx11::string::~string((string *)&local_2698);
      std::operator+(&local_26b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2678
                     ,"control.tar.gz");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&topLevelString.field_2 + 8),&local_26b8);
      std::__cxx11::string::~string((string *)&local_26b8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&outputFileName.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2678
                     ,"data.tar");
      std::operator+(&local_26d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&outputFileName.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9e0)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&topLevelString.field_2 + 8),&local_26d8);
      std::__cxx11::string::~string((string *)&local_26d8);
      std::__cxx11::string::~string((string *)(outputFileName.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2738,"CPACK_TOPLEVEL_DIRECTORY",&local_2739);
      pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2738);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2718,pcVar5,&local_273a);
      std::allocator<char>::~allocator((allocator<char> *)&local_273a);
      std::__cxx11::string::~string((string *)&local_2738);
      std::allocator<char>::~allocator((allocator<char> *)&local_2739);
      std::__cxx11::string::operator+=(local_2718,"/");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&res,"CPACK_OUTPUT_FILE_NAME",
                 (allocator *)(tmpFile.field_2._M_local_buf + 0xf));
      pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&res);
      std::__cxx11::string::operator+=(local_2718,pcVar5);
      std::__cxx11::string::~string((string *)&res);
      std::allocator<char>::~allocator((allocator<char> *)(tmpFile.field_2._M_local_buf + 0xf));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      tmpFile.field_2._8_4_ =
           ar_append(pcVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&topLevelString.field_2 + 8));
      bVar2 = tmpFile.field_2._8_4_ == 0;
      if (bVar2) {
        data_tar.PermissionsMask.IsValueSet = true;
        data_tar.PermissionsMask._5_3_ = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_27a8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                   (allocator *)&ofs.field_0x247);
        pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_27a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2788,pcVar5,(allocator *)&ofs.field_0x246);
        std::allocator<char>::~allocator((allocator<char> *)&ofs.field_0x246);
        std::__cxx11::string::~string((string *)&local_27a8);
        std::allocator<char>::~allocator((allocator<char> *)&ofs.field_0x247);
        std::__cxx11::string::operator+=(local_2788,"/Deb.log");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_29f8,pcVar5,false);
        poVar6 = std::operator<<((ostream *)local_29f8,"# Problem creating archive using: ");
        pvVar8 = (void *)std::ostream::operator<<(poVar6,tmpFile.field_2._8_4_);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        data_tar.PermissionsMask.IsValueSet = true;
        data_tar.PermissionsMask._5_3_ = 0;
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_29f8);
        std::__cxx11::string::~string(local_2788);
      }
      this_local._4_4_ = (uint)bVar2;
      std::__cxx11::string::~string(local_2718);
      std::__cxx11::string::~string((string *)local_2678);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&topLevelString.field_2 + 8));
    }
    std::__cxx11::string::~string((string *)&fileStream_control_tar.field_0x240);
    std::__cxx11::string::~string((string *)&out_2.field_0x240);
  }
  std::__cxx11::string::~string((string *)local_b98);
  std::__cxx11::string::~string((string *)local_9e0);
  std::__cxx11::string::~string((string *)local_968);
  std::__cxx11::string::~string((string *)local_320);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_38);
  return this_local._4_4_;
}

Assistant:

int cmCPackDebGenerator::createDeb()
{
  // debian-binary file
  std::string dbfilename;
    dbfilename += this->GetOption("GEN_WDIR");
  dbfilename += "/debian-binary";
    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(dbfilename.c_str());
    out << "2.0";
    out << std::endl; // required for valid debian package
    }

  // control file
  std::string ctlfilename;
    ctlfilename = this->GetOption("GEN_WDIR");
  ctlfilename += "/control";

  // debian policy enforce lower case for package name
  // mandatory entries:
  std::string debian_pkg_name = cmsys::SystemTools::LowerCase(
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME") );
  const char* debian_pkg_version =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  const char* debian_pkg_section =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  const char* debian_pkg_priority =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  const char* debian_pkg_arch =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  const char* maintainer =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  const char* desc =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  // optional entries
  const char* debian_pkg_dep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  const char* debian_pkg_rec =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  const char* debian_pkg_sug =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  const char* debian_pkg_url =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  const char* debian_pkg_predep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  const char* debian_pkg_enhances =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  const char* debian_pkg_breaks =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  const char* debian_pkg_conflicts =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  const char* debian_pkg_provides =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  const char* debian_pkg_replaces =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");
  const char* debian_pkg_source =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");


    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(ctlfilename.c_str());
    out << "Package: " << debian_pkg_name << "\n";
    out << "Version: " << debian_pkg_version << "\n";
    out << "Section: " << debian_pkg_section << "\n";
    out << "Priority: " << debian_pkg_priority << "\n";
    out << "Architecture: " << debian_pkg_arch << "\n";
    if(debian_pkg_source && *debian_pkg_source)
      {
      out << "Source: " << debian_pkg_source << "\n";
      }
    if(debian_pkg_dep && *debian_pkg_dep)
      {
      out << "Depends: " << debian_pkg_dep << "\n";
      }
    if(debian_pkg_rec && *debian_pkg_rec)
      {
      out << "Recommends: " << debian_pkg_rec << "\n";
      }
    if(debian_pkg_sug && *debian_pkg_sug)
      {
      out << "Suggests: " << debian_pkg_sug << "\n";
      }
    if(debian_pkg_url && *debian_pkg_url)
      {
      out << "Homepage: " << debian_pkg_url << "\n";
      }
    if (debian_pkg_predep && *debian_pkg_predep)
      {
      out << "Pre-Depends: " << debian_pkg_predep << "\n";
      }
    if (debian_pkg_enhances && *debian_pkg_enhances)
      {
      out << "Enhances: " << debian_pkg_enhances << "\n";
      }
    if (debian_pkg_breaks && *debian_pkg_breaks)
      {
      out << "Breaks: " << debian_pkg_breaks << "\n";
      }
    if (debian_pkg_conflicts && *debian_pkg_conflicts)
      {
      out << "Conflicts: " << debian_pkg_conflicts << "\n";
      }
    if (debian_pkg_provides && *debian_pkg_provides)
      {
      out << "Provides: " << debian_pkg_provides << "\n";
      }
    if (debian_pkg_replaces && *debian_pkg_replaces)
      {
      out << "Replaces: " << debian_pkg_replaces << "\n";
      }
    unsigned long totalSize = 0;
    {
      std::string dirName = this->GetOption("CPACK_TEMPORARY_DIRECTORY");
      dirName += '/';
      for (std::vector<std::string>::const_iterator fileIt =
           packageFiles.begin();
           fileIt != packageFiles.end(); ++ fileIt )
        {
        totalSize += cmSystemTools::FileLength(*fileIt);
        }
    }
    out << "Installed-Size: " << (totalSize + 1023) / 1024 << "\n";
    out << "Maintainer: " << maintainer << "\n";
    out << "Description: " << desc << "\n";
    out << std::endl;
    }

  const std::string strGenWDIR(this->GetOption("GEN_WDIR"));

  cmArchiveWrite::Compress tar_compression_type = cmArchiveWrite::CompressGZip;
  const char* debian_compression_type =
      this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE");
  if(!debian_compression_type)
    {
    debian_compression_type = "gzip";
    }

  std::string compression_suffix;
  if(!strcmp(debian_compression_type, "lzma")) {
      compression_suffix = ".lzma";
      tar_compression_type = cmArchiveWrite::CompressLZMA;
  } else if(!strcmp(debian_compression_type, "xz")) {
      compression_suffix = ".xz";
      tar_compression_type = cmArchiveWrite::CompressXZ;
  } else if(!strcmp(debian_compression_type, "bzip2")) {
      compression_suffix = ".bz2";
      tar_compression_type = cmArchiveWrite::CompressBZip2;
  } else if(!strcmp(debian_compression_type, "gzip")) {
      compression_suffix = ".gz";
      tar_compression_type = cmArchiveWrite::CompressGZip;
  } else if(!strcmp(debian_compression_type, "none")) {
      compression_suffix = "";
      tar_compression_type = cmArchiveWrite::CompressNone;
  } else {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Error unrecognized compression type: "
                    << debian_compression_type << std::endl);
  }


  std::string filename_data_tar = strGenWDIR
      + "/data.tar" + compression_suffix;

  // atomic file generation for data.tar
  {
    cmGeneratedFileStream fileStream_data_tar;
    fileStream_data_tar.Open(filename_data_tar.c_str(), false, true);
    if(!fileStream_data_tar)
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Error opening the file \"" << filename_data_tar << "\" for writing"
          << std::endl);
      return 0;
      }
    cmArchiveWrite data_tar(fileStream_data_tar, tar_compression_type, "paxr");

    // uid/gid should be the one of the root user, and this root user has
    // always uid/gid equal to 0.
    data_tar.SetUIDAndGID(0u, 0u);
    data_tar.SetUNAMEAndGNAME("root", "root");

    // now add all directories which have to be compressed
    // collect all top level install dirs for that
    // e.g. /opt/bin/foo, /usr/bin/bar and /usr/bin/baz would
    // give /usr and /opt
    size_t topLevelLength = strGenWDIR.length();
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "WDIR: \""
            << strGenWDIR
            << "\", length = " << topLevelLength
            << std::endl);
    std::set<std::string> orderedFiles;

    // we have to reconstruct the parent folders as well

    for (std::vector<std::string>::const_iterator fileIt =
         packageFiles.begin();
         fileIt != packageFiles.end(); ++ fileIt )
      {
      std::string currentPath = *fileIt;
      while(currentPath != strGenWDIR)
        {
        // the last one IS strGenWDIR, but we do not want this one:
        // XXX/application/usr/bin/myprogram with GEN_WDIR=XXX/application
        // should not add XXX/application
        orderedFiles.insert(currentPath);
        currentPath = cmSystemTools::CollapseCombinedPath(currentPath, "..");
        }
      }


    for (std::set<std::string>::const_iterator fileIt =
         orderedFiles.begin();
         fileIt != orderedFiles.end(); ++ fileIt )
      {
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "FILEIT: \"" << *fileIt << "\""
                    << std::endl);
      std::string::size_type slashPos = fileIt->find('/', topLevelLength+1);
      std::string relativeDir = fileIt->substr(topLevelLength,
                                               slashPos - topLevelLength);
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "RELATIVEDIR: \"" << relativeDir
                    << "\"" << std::endl);

      // do not recurse because the loop will do it
      if(!data_tar.Add(*fileIt, topLevelLength, ".", false))
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem adding file to tar:" << std::endl
                      << "#top level directory: "
                      << strGenWDIR << std::endl
                      << "#file: " << *fileIt << std::endl
                      << "#error:" << data_tar.GetError() << std::endl);
        return 0;
        }
      }
  } // scope for file generation


  std::string md5filename = strGenWDIR + "/md5sums";
  {
    // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(md5filename.c_str());

    std::string topLevelWithTrailingSlash =
        this->GetOption("CPACK_TEMPORARY_DIRECTORY");
    topLevelWithTrailingSlash += '/';
    for (std::vector<std::string>::const_iterator fileIt =
           packageFiles.begin();
         fileIt != packageFiles.end(); ++ fileIt )
      {
      // hash only regular files
      if(   cmSystemTools::FileIsDirectory(*fileIt)
         || cmSystemTools::FileIsSymlink(*fileIt))
        {
        continue;
        }

      char md5sum[33];
      if(!cmSystemTools::ComputeFileMD5(*fileIt, md5sum))
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem computing the md5 of "
                      << *fileIt << std::endl);
        }

      md5sum[32] = 0;

      std::string output(md5sum);
      output += "  " + *fileIt + "\n";
      // debian md5sums entries are like this:
      // 014f3604694729f3bf19263bac599765  usr/bin/ccmake
      // thus strip the full path (with the trailing slash)
      cmSystemTools::ReplaceString(output,
                                   topLevelWithTrailingSlash.c_str(), "");
      out << output;
      }
    // each line contains a eol.
    // Do not end the md5sum file with yet another (invalid)
  }



  std::string filename_control_tar = strGenWDIR + "/control.tar.gz";
  // atomic file generation for control.tar
  {
    cmGeneratedFileStream fileStream_control_tar;
    fileStream_control_tar.Open(filename_control_tar.c_str(), false, true);
    if(!fileStream_control_tar)
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Error opening the file \"" << filename_control_tar
          << "\" for writing" << std::endl);
      return 0;
      }
    cmArchiveWrite control_tar(fileStream_control_tar,
                               cmArchiveWrite::CompressGZip,
                               "paxr");

    // sets permissions and uid/gid for the files
    control_tar.SetUIDAndGID(0u, 0u);
    control_tar.SetUNAMEAndGNAME("root", "root");

    /* permissions are set according to
    https://www.debian.org/doc/debian-policy/ch-files.html#s-permissions-owners
    and
    https://lintian.debian.org/tags/control-file-has-bad-permissions.html
    */
    const mode_t permission644 = S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    const mode_t permissionExecute = S_IXUSR | S_IXGRP | S_IXOTH;
    const mode_t permission755 = permission644 | permissionExecute;

    // for md5sum and control (that we have generated here), we use 644
    // (RW-R--R--)
    // so that deb lintian doesn't warn about it
    control_tar.SetPermissions(permission644);

    // adds control and md5sums
    if(   !control_tar.Add(md5filename, strGenWDIR.length(), ".")
       || !control_tar.Add(strGenWDIR + "/control", strGenWDIR.length(), "."))
      {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
            "Error adding file to tar:" << std::endl
            << "#top level directory: "
               << strGenWDIR << std::endl
            << "#file: \"control\" or \"md5sums\"" << std::endl
            << "#error:" << control_tar.GetError() << std::endl);
        return 0;
      }

    // for the other files, we use
    // -either the original permission on the files
    // -either a permission strictly defined by the Debian policies
    const char* controlExtra =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA");
    if( controlExtra )
      {
      // permissions are now controlled by the original file permissions

      const bool permissionStrictPolicy =
        this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION");

      static const char* strictFiles[] = {
        "config", "postinst", "postrm", "preinst", "prerm"
        };
      std::set<std::string> setStrictFiles(
        strictFiles,
        strictFiles + sizeof(strictFiles)/sizeof(strictFiles[0]));

      // default
      control_tar.ClearPermissions();

      std::vector<std::string> controlExtraList;
      cmSystemTools::ExpandListArgument(controlExtra, controlExtraList);
      for(std::vector<std::string>::iterator i = controlExtraList.begin();
          i != controlExtraList.end(); ++i)
        {
        std::string filenamename =
          cmsys::SystemTools::GetFilenameName(*i);
        std::string localcopy = strGenWDIR + "/" + filenamename;

        if(permissionStrictPolicy)
          {
          control_tar.SetPermissions(setStrictFiles.count(filenamename) ?
            permission755 : permission644);
          }

        // if we can copy the file, it means it does exist, let's add it:
        if( cmsys::SystemTools::CopyFileIfDifferent(*i, localcopy) )
          {
          control_tar.Add(localcopy, strGenWDIR.length(), ".");
          }
        }
      }
  }


  // ar -r your-package-name.deb debian-binary control.tar.* data.tar.*
  // since debian packages require BSD ar (most Linux distros and even
  // FreeBSD and NetBSD ship GNU ar) we use a copy of OpenBSD ar here.
  std::vector<std::string> arFiles;
  std::string topLevelString = strGenWDIR + "/";
  arFiles.push_back(topLevelString + "debian-binary");
  arFiles.push_back(topLevelString + "control.tar.gz");
  arFiles.push_back(topLevelString + "data.tar" + compression_suffix);
  std::string outputFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  outputFileName += "/";
  outputFileName += this->GetOption("CPACK_OUTPUT_FILE_NAME");
  int res = ar_append(outputFileName.c_str(), arFiles);
  if ( res!=0 )
    {
    std::string tmpFile = this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Problem creating archive using: " << res << std::endl;
    return 0;
    }
  return 1;
}